

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_vmprintf(char *zFormat,__va_list_tag *ap)

{
  int iVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char zBase [70];
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined6 uStack_30;
  undefined2 uStack_2a;
  undefined6 uStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_28 = 0xaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaaaaaa;
  uStack_2a = 0xaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    local_88._8_8_ = &local_68;
    local_88._0_8_ = (sqlite3 *)0x0;
    local_78 = (undefined1 *)0x3b9aca0000000046;
    puStack_70 = (undefined1 *)((ulong)puStack_70 & 0xffff000000000000);
    sqlite3_str_vappendf((sqlite3_str *)local_88,zFormat,ap);
    pcVar2 = sqlite3StrAccumFinish((StrAccum *)local_88);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pcVar2;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API char *sqlite3_vmprintf(const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zFormat==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return 0;
#endif
  sqlite3StrAccumInit(&acc, 0, zBase, sizeof(zBase), SQLITE_MAX_LENGTH);
  sqlite3_str_vappendf(&acc, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  return z;
}